

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O0

string * __thiscall
duckdb::StringStatisticsState::GetMinValue_abi_cxx11_(StringStatisticsState *this)

{
  ulong uVar1;
  long *in_RSI;
  string *in_RDI;
  
  uVar1 = (**(code **)(*in_RSI + 0x10))();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(in_RDI);
  }
  else {
    std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 2));
  }
  return in_RDI;
}

Assistant:

string GetMinValue() override {
		return HasStats() ? min : string();
	}